

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O3

int Prs_ManReadExpression(Prs_Man_t *p,int OutItem)

{
  Vec_Int_t *p_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  int iVar6;
  byte *pbVar7;
  byte bVar8;
  bool bVar9;
  uint extraout_EDX;
  uint extraout_EDX_00;
  int extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  ulong uVar10;
  char *pcVar11;
  bool bVar12;
  int ModName;
  bool bVar13;
  char Open;
  uint local_34;
  
  p_00 = &p->vTemp;
  (p->vTemp).nSize = 0;
  Vec_IntPush(p_00,0);
  Vec_IntPush(p_00,OutItem);
  pbVar7 = (byte *)p->pLimit;
  pbVar5 = (byte *)p->pCur;
  while (pbVar5 < pbVar7) {
    while( true ) {
      bVar8 = *pbVar5;
      uVar10 = (ulong)bVar8;
      if (0x2f < uVar10) goto LAB_003ea27e;
      if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) break;
      pbVar5 = pbVar5 + 1;
      p->pCur = (char *)pbVar5;
    }
    if (uVar10 != 0x2f) {
      if (uVar10 != 0) {
LAB_003ea27e:
        bVar12 = true;
        if (bVar8 != 0x28) goto LAB_003ea358;
        bVar8 = 0x28;
        pbVar7 = pbVar5;
        goto LAB_003ea290;
      }
      break;
    }
    if (pbVar5[1] == 0x2a) {
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar7 <= pbVar5) {
LAB_003ea27c:
        bVar8 = *pbVar5;
        goto LAB_003ea27e;
      }
      while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar7) goto LAB_003ea27c;
      }
      pbVar5 = pbVar5 + 2;
    }
    else {
      if (pbVar5[1] != 0x2f) {
        bVar12 = true;
        goto LAB_003ea358;
      }
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar7 <= pbVar5) goto LAB_003ea27c;
      while (bVar8 = *pbVar5, pbVar5 = pbVar5 + 1, bVar8 != 10) {
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar7) goto LAB_003ea27c;
      }
    }
    p->pCur = (char *)pbVar5;
  }
LAB_003ea569:
  if (p->ErrorStr[0] == '\0') {
    builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
    if (p->ErrorStr[0] == '\0') {
      builtin_strncpy(p->ErrorStr,"Error number 24.",0x11);
      return 0;
    }
  }
  goto LAB_003eac30;
  while (bVar8 = *pbVar7, bVar8 != 0x3b) {
LAB_003ea290:
    pbVar7 = pbVar7 + 1;
    if (bVar8 == 0x3e) {
      bVar8 = 0x28;
      pbVar7 = pbVar5;
      goto LAB_003ea2aa;
    }
  }
  bVar12 = true;
  goto LAB_003ea2bd;
LAB_003ea358:
  if (pbVar7 <= pbVar5) goto LAB_003ea569;
  while( true ) {
    uVar10 = (ulong)*pbVar5;
    local_34 = (uint)*pbVar5;
    if (0x2f < uVar10) goto LAB_003ea3ef;
    if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) break;
    pbVar5 = pbVar5 + 1;
    p->pCur = (char *)pbVar5;
  }
  if (uVar10 != 0x2f) {
    if (uVar10 != 0) {
LAB_003ea3ef:
      Open = (char)local_34 != '{';
      if ((bool)Open && 9 < (byte)((char)local_34 - 0x30U)) {
        if (local_34 < 0x40) {
          if (local_34 != 0x21) {
            if (local_34 == 0x26) {
              local_34 = 0x1b;
            }
            else {
              if (local_34 != 0x2d) goto LAB_003ea5cf;
              local_34 = 0x37;
            }
          }
LAB_003ea715:
          p->pCur = (char *)(pbVar5 + 1);
          iVar6 = Prs_ManUtilSkipSpaces(p);
          uVar2 = extraout_EDX_02;
          if (iVar6 == 0) {
            if (*(char *)&((Prs_Man_t *)p->pCur)->pName == '(') {
              pcVar11 = Prs_ManFindClosingParenthesis
                                  ((Prs_Man_t *)p->pCur,Open,(char)extraout_EDX_02);
              if (pcVar11 == (char *)0x0) {
                pcVar11 = "Expecting closing parenthesis 2.";
                uVar2 = extraout_EDX_03;
                goto LAB_003ea758;
              }
              *pcVar11 = ' ';
              *p->pCur = ' ';
            }
            iVar6 = Prs_ManUtilSkipSpaces(p);
            uVar2 = extraout_EDX_04;
            if (iVar6 == 0) {
              iVar6 = Prs_ManReadSignal(p);
              if (iVar6 != 0) {
                Vec_IntPush(p_00,0);
                Vec_IntPush(p_00,iVar6);
                goto LAB_003ea42c;
              }
              pcVar11 = "Cannot read name after a unary operator.";
              uVar2 = extraout_EDX_05;
              goto LAB_003ea758;
            }
          }
        }
        else {
          if (0x7b < local_34) {
            if (local_34 == 0x7c) {
              local_34 = 0x1d;
            }
            else {
              if (local_34 != 0x7e) goto LAB_003ea5cf;
              local_34 = 9;
            }
            goto LAB_003ea715;
          }
          if (local_34 == 0x40) {
            local_34 = 0x38;
            goto LAB_003ea715;
          }
          if (local_34 == 0x5e) {
            local_34 = 0x1f;
            goto LAB_003ea715;
          }
LAB_003ea5cf:
          uVar2 = Prs_ManReadSignal(p);
          if (uVar2 == 0) {
            pcVar11 = "Cannot read name after a binary operator.";
            uVar2 = extraout_EDX;
            goto LAB_003ea758;
          }
          if ((int)uVar2 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x13d,"int Abc_Lit2Var2(int)");
          }
          if (uVar2 >> 2 != p->FuncNameId) {
            Vec_IntPush(p_00,0);
            Vec_IntPush(p_00,uVar2);
            iVar3 = Prs_ManUtilSkipSpaces(p);
            iVar6 = extraout_EDX_06;
            if (iVar3 != 0) goto LAB_003ea7ce;
            pbVar5 = (byte *)p->pCur;
            bVar8 = *pbVar5;
            if (bVar8 < 0x5b) {
              iVar6 = 0x9b15f0;
              switch(bVar8) {
              case 0x21:
                if (pbVar5[1] != 0x3d) goto switchD_003ea86a_caseD_22;
                p->pCur = (char *)(pbVar5 + 2);
                local_34 = 0x40;
                break;
              default:
switchD_003ea86a_caseD_22:
                pcVar11 = "Unsupported operation.";
LAB_003ea7d5:
                Prs_ManErrorSet(p,pcVar11,iVar6);
                return 0;
              case 0x25:
                p->pCur = (char *)(pbVar5 + 1);
                local_34 = 0x34;
                break;
              case 0x26:
                if (pbVar5[1] == 0x26) {
                  p->pCur = (char *)(pbVar5 + 2);
                  local_34 = 0x22;
                }
                else {
                  p->pCur = (char *)(pbVar5 + 1);
                  local_34 = 10;
                }
                break;
              case 0x2a:
                if (pbVar5[1] == 0x2a) {
                  p->pCur = (char *)(pbVar5 + 2);
                  local_34 = 0x36;
                }
                else {
                  p->pCur = (char *)(pbVar5 + 1);
                  local_34 = 0x31;
                }
                break;
              case 0x2b:
                p->pCur = (char *)(pbVar5 + 1);
                local_34 = 0x2f;
                break;
              case 0x2c:
              case 0x3b:
                goto switchD_003ea86a_caseD_2c;
              case 0x2d:
                p->pCur = (char *)(pbVar5 + 1);
                local_34 = 0x30;
                break;
              case 0x2f:
                p->pCur = (char *)(pbVar5 + 1);
                local_34 = 0x33;
                break;
              case 0x3c:
                if (pbVar5[1] == 0x3d) {
                  if (pbVar5[1] != 0x3d) goto switchD_003ea86a_caseD_22;
                  p->pCur = (char *)(pbVar5 + 2);
                  local_34 = 0x3c;
                }
                else if (pbVar5[1] == 0x3c) {
                  if (pbVar5[2] == 0x3c) {
                    if (pbVar5[2] != 0x3c) goto LAB_003eab45;
                    p->pCur = (char *)(pbVar5 + 3);
                    local_34 = 0x43;
                  }
                  else {
                    p->pCur = (char *)(pbVar5 + 2);
                    local_34 = (uint)(bVar12 ^ 1) * 4 + 0x41;
                  }
                }
                else {
LAB_003eab45:
                  p->pCur = (char *)(pbVar5 + 1);
                  local_34 = 0x3b;
                }
                break;
              case 0x3d:
                if (pbVar5[1] != 0x3d) goto switchD_003ea86a_caseD_22;
                p->pCur = (char *)(pbVar5 + 2);
                local_34 = 0x3f;
                break;
              case 0x3e:
                if (pbVar5[1] == 0x3d) {
                  if (pbVar5[1] != 0x3d) goto switchD_003ea86a_caseD_22;
                  p->pCur = (char *)(pbVar5 + 2);
                  local_34 = 0x3d;
                }
                else if (pbVar5[1] == 0x3e) {
                  if (pbVar5[2] == 0x3e) {
                    if (pbVar5[2] != 0x3e) goto LAB_003eab31;
                    p->pCur = (char *)(pbVar5 + 3);
                    local_34 = 0x44;
                  }
                  else {
                    p->pCur = (char *)(pbVar5 + 2);
                    local_34 = (uint)(bVar12 ^ 1) * 4 + 0x42;
                  }
                }
                else {
LAB_003eab31:
                  p->pCur = (char *)(pbVar5 + 1);
                  local_34 = 0x3e;
                }
                break;
              case 0x3f:
                p->pCur = (char *)(pbVar5 + 1);
                iVar6 = Prs_ManReadSignal(p);
                if (iVar6 == 0) {
                  return 0;
                }
                Vec_IntPush(p_00,0);
                Vec_IntPush(p_00,iVar6);
                iVar3 = Prs_ManUtilSkipSpaces(p);
                iVar6 = extraout_EDX_07;
                if (iVar3 == 0) {
                  if (*p->pCur != ':') {
                    pcVar11 = "MUX lacks the colon symbol (:).";
                    goto LAB_003ea7d5;
                  }
                  p->pCur = p->pCur + 1;
                  iVar6 = Prs_ManReadSignal(p);
                  if (iVar6 == 0) {
                    return 0;
                  }
                  Vec_IntPush(p_00,0);
                  Vec_IntPush(p_00,iVar6);
                  iVar3 = Prs_ManUtilSkipSpaces(p);
                  iVar6 = extraout_EDX_08;
                  if (iVar3 == 0) {
                    local_34 = 0x12;
                    if ((p->vTemp).nSize != 8) {
                      __assert_fail("Vec_IntSize(&p->vTemp) == 8",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                                    ,0x3e2,"int Prs_ManReadExpression(Prs_Man_t *, int)");
                    }
                    goto LAB_003ea42c;
                  }
                }
                goto LAB_003ea7ce;
              }
            }
            else if (bVar8 == 0x5e) {
              if (pbVar5[1] == 0x5e) goto switchD_003ea86a_caseD_22;
              p->pCur = (char *)(pbVar5 + 1);
              local_34 = 0xe;
            }
            else {
              if (bVar8 != 0x7c) {
                if (bVar8 == 0x5b) {
                  __assert_fail("!Prs_ManIsChar(p, \'[\')",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                                ,0x3cd,"int Prs_ManReadExpression(Prs_Man_t *, int)");
                }
                goto switchD_003ea86a_caseD_22;
              }
              if (pbVar5[1] == 0x7c) {
                p->pCur = (char *)(pbVar5 + 2);
                local_34 = 0x24;
              }
              else {
                p->pCur = (char *)(pbVar5 + 1);
                local_34 = 0xc;
              }
            }
            iVar6 = Prs_ManReadSignal(p);
            if (iVar6 == 0) {
              return 0;
            }
            Vec_IntPush(p_00,0);
            Vec_IntPush(p_00,iVar6);
            if (local_34 == 0x2f) {
              Vec_IntInsert(p_00,2,0);
              Vec_IntInsert(p_00,3,0);
              local_34 = 0x2f;
            }
            goto LAB_003ea42c;
          }
          iVar6 = Prs_ManUtilSkipSpaces(p);
          uVar2 = extraout_EDX_00;
          if ((iVar6 == 0) && (*p->pCur == '(')) {
            p->pCur = p->pCur + 1;
            iVar3 = 1;
            iVar6 = Prs_ManReadSignalList(p,p_00,')',1);
            uVar2 = (p->vTemp).nSize;
            if (p->FuncRangeId != 0) {
              iVar3 = Ptr_NtkRangeSize((Prs_Ntk_t *)p->pNtk->vHash->vObjs,p->FuncRangeId);
            }
            p->FuncNameId = 0;
            p->FuncRangeId = 0;
            if (iVar6 == 0) {
              return 0;
            }
            ModName = 0x2d;
            if ((uVar2 & 0xfffffffe) != 2) {
              iVar4 = (int)uVar2 / 2;
              ModName = 0x29;
              if (iVar4 != iVar3 + 1) {
                iVar6 = (1 << ((byte)iVar3 & 0x1f)) + 1;
                ModName = 0x28;
                if (iVar4 != iVar6) {
                  pcVar11 = "Cannot determine word-level operator.";
                  goto LAB_003ea7d5;
                }
              }
            }
            p->pCur = p->pCur + 1;
            iVar3 = Prs_ManUtilSkipSpaces(p);
            iVar6 = extraout_EDX_01;
            if (iVar3 == 0) {
              Vec_IntInsert(p_00,0,0);
              Vec_IntInsert(p_00,1,OutItem);
              Prs_NtkAddBox(p->pNtk,ModName,0,p_00);
              return 1;
            }
LAB_003ea7ce:
            pcVar11 = "Error number 24.";
            goto LAB_003ea7d5;
          }
        }
        pcVar11 = "Error number 24.";
        goto LAB_003ea758;
      }
      iVar6 = Prs_ManReadSignal(p);
      Vec_IntPush(p_00,0);
      Vec_IntPush(p_00,iVar6);
switchD_003ea86a_caseD_2c:
      local_34 = 8;
LAB_003ea42c:
      pbVar7 = (byte *)p->pLimit;
      pbVar5 = (byte *)p->pCur;
      goto LAB_003ea434;
    }
    goto LAB_003ea569;
  }
  if (pbVar5[1] == 0x2a) {
    pbVar5 = pbVar5 + 2;
    p->pCur = (char *)pbVar5;
    if (pbVar7 <= pbVar5) {
LAB_003ea3ed:
      local_34 = (uint)*pbVar5;
      goto LAB_003ea3ef;
    }
    while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
      pbVar5 = pbVar5 + 1;
      p->pCur = (char *)pbVar5;
      if (pbVar5 == pbVar7) goto LAB_003ea3ed;
    }
    pbVar5 = pbVar5 + 2;
  }
  else {
    if (pbVar5[1] != 0x2f) {
      local_34 = 0x2f;
      goto LAB_003ea3ef;
    }
    pbVar5 = pbVar5 + 2;
    p->pCur = (char *)pbVar5;
    if (pbVar7 <= pbVar5) goto LAB_003ea3ed;
    while (bVar8 = *pbVar5, pbVar5 = pbVar5 + 1, bVar8 != 10) {
      p->pCur = (char *)pbVar5;
      if (pbVar5 == pbVar7) goto LAB_003ea3ed;
    }
  }
  p->pCur = (char *)pbVar5;
  goto LAB_003ea358;
LAB_003ea434:
  if (pbVar7 <= pbVar5) goto LAB_003ea569;
  while( true ) {
    uVar10 = (ulong)*pbVar5;
    uVar2 = (uint)*pbVar5;
    if (0x2f < uVar10) goto LAB_003ea7eb;
    if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) break;
    pbVar5 = pbVar5 + 1;
    p->pCur = (char *)pbVar5;
  }
  if (uVar10 != 0x2f) {
    if (uVar10 != 0) goto LAB_003ea7eb;
    goto LAB_003ea569;
  }
  bVar8 = pbVar5[1];
  uVar2 = (uint)bVar8;
  if (bVar8 == 0x2a) {
    pbVar5 = pbVar5 + 2;
    p->pCur = (char *)pbVar5;
    if (pbVar7 <= pbVar5) goto LAB_003ea7eb;
    while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
      pbVar5 = pbVar5 + 1;
      p->pCur = (char *)pbVar5;
      if (pbVar5 == pbVar7) goto LAB_003ea7eb;
    }
    pbVar5 = pbVar5 + 2;
  }
  else {
    if (bVar8 != 0x2f) {
LAB_003ea7eb:
      if (bVar12 == false) {
        Prs_ManUtilSkipUntilWord(p,";");
        p->pCur = p->pCur + -1;
      }
      else if ((*pbVar5 != 0x2c) && (*pbVar5 != 0x3b)) {
        pcVar11 = "Trailing symbols on this line.";
LAB_003ea758:
        Prs_ManErrorSet(p,pcVar11,uVar2);
        return 0;
      }
      Prs_NtkAddBox(p->pNtk,local_34,0,p_00);
      return 1;
    }
    pbVar5 = pbVar5 + 2;
    p->pCur = (char *)pbVar5;
    if (pbVar7 <= pbVar5) goto LAB_003ea7eb;
    while (bVar8 = *pbVar5, pbVar5 = pbVar5 + 1, bVar8 != 10) {
      p->pCur = (char *)pbVar5;
      if (pbVar5 == pbVar7) goto LAB_003ea7eb;
    }
  }
  p->pCur = (char *)pbVar5;
  goto LAB_003ea434;
  while (bVar8 = *pbVar7, bVar8 != 0x3b) {
LAB_003ea2aa:
    pbVar7 = pbVar7 + 1;
    bVar12 = bVar8 != 0x3c;
    if (bVar8 == 0x3c) break;
  }
LAB_003ea2bd:
  bVar8 = 0x28;
  iVar6 = 0;
  bVar9 = true;
  do {
    if ((bVar9) && (iVar6 = (iVar6 + (uint)(bVar8 == 0x28)) - (uint)(bVar8 == 0x29), iVar6 == 0)) {
      *pbVar5 = 0x20;
      *p->pCur = ' ';
      pbVar7 = (byte *)p->pLimit;
      pbVar5 = (byte *)p->pCur;
      goto LAB_003ea358;
    }
    bVar13 = bVar8 != 0x5c;
    bVar1 = bVar8 == 0x20;
    if (!bVar13) {
      bVar1 = bVar13;
    }
    if (bVar9) {
      bVar1 = bVar13;
    }
    bVar9 = bVar1;
    bVar8 = pbVar5[1];
    pbVar5 = pbVar5 + 1;
  } while (bVar8 != 0);
  if (p->ErrorStr[0] == '\0') {
    builtin_strncpy(p->ErrorStr,"Expecting closing parenthesis 1.",0x21);
    return 0;
  }
LAB_003eac30:
  __assert_fail("!p->ErrorStr[0]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaPrs.h"
                ,0xc0,"int Prs_ManErrorSet(Prs_Man_t *, char *, int)");
}

Assistant:

static inline int Prs_ManReadExpression( Prs_Man_t * p, int OutItem )
{
    char * pClose;
    int Item, Type = CBA_OBJ_NONE;
    int fRotating = 0;

    // write output name
    Vec_IntClear( &p->vTemp );
    Vec_IntPush( &p->vTemp, 0 );
    Vec_IntPush( &p->vTemp, OutItem );
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 24.", 0);
    if ( Prs_ManIsChar(p, '(') )
    {
        // THIS IS A HACK TO DETECT rotating shifters:  try to find both << and >> on the same line
        if ( Prs_ManUtilDetectTwo(p, '>', '>') && Prs_ManUtilDetectTwo(p, '<', '<') )
            fRotating = 1;
        pClose = Prs_ManFindClosingParenthesis( p, '(', ')' );
        if ( pClose == NULL )
            return Prs_ManErrorSet(p, "Expecting closing parenthesis 1.", 0); 
        *p->pCur = *pClose = ' ';
    }
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 24.", 0);
    // read constant or concatenation
    if ( Prs_ManIsDigit(p) || Prs_ManIsChar(p, '{') )
    {
        Item = Prs_ManReadSignal( p );
        // write constant
        Vec_IntPush( &p->vTemp, 0 );
        Vec_IntPush( &p->vTemp, Item );
        Type = CBA_BOX_BUF;
    }
    else if ( Prs_ManIsChar(p, '!') || Prs_ManIsChar(p, '~') || Prs_ManIsChar(p, '@') ||
              Prs_ManIsChar(p, '&') || Prs_ManIsChar(p, '|') || Prs_ManIsChar(p, '^') || Prs_ManIsChar(p, '-') )
    {
        if ( Prs_ManIsChar(p, '!') )
            Type = CBA_BOX_LNOT;
        else if ( Prs_ManIsChar(p, '~') )
            Type = CBA_BOX_INV;
        else if ( Prs_ManIsChar(p, '@') )
            Type = CBA_BOX_SQRT;
        else if ( Prs_ManIsChar(p, '&') )
            Type = CBA_BOX_RAND;
        else if ( Prs_ManIsChar(p, '|') )
            Type = CBA_BOX_ROR;
        else if ( Prs_ManIsChar(p, '^') )
            Type = CBA_BOX_RXOR;
        else if ( Prs_ManIsChar(p, '-') )
            Type = CBA_BOX_MIN;
        else assert( 0 );
        p->pCur++;
        if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 24.", 0);
        // skip parentheses
        if ( Prs_ManIsChar(p, '(') )
        {
            pClose = Prs_ManFindClosingParenthesis( p, '(', ')' );
            if ( pClose == NULL )
                return Prs_ManErrorSet(p, "Expecting closing parenthesis 2.", 0); 
            *p->pCur = *pClose = ' ';
        }
        if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 24.", 0);
        // read first name
        Item = Prs_ManReadSignal( p );
        if ( Item == 0 )                        return Prs_ManErrorSet(p, "Cannot read name after a unary operator.", 0);
        Vec_IntPush( &p->vTemp, 0 );
        Vec_IntPush( &p->vTemp, Item );
    }
    else
    {
        // read first name
        Item = Prs_ManReadSignal( p );
        if ( Item == 0 )                        return Prs_ManErrorSet(p, "Cannot read name after a binary operator.", 0);
        // check if this is a recent function
        if ( Abc_Lit2Var2(Item) == p->FuncNameId )
        {
            int Status, nInputs, RangeSize;
            if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 24.", 0);
            if ( !Prs_ManIsChar(p, '(') )       return Prs_ManErrorSet(p, "Error number 24.", 0);
            p->pCur++;
            Status = Prs_ManReadSignalList( p, &p->vTemp, ')', 1 );
            nInputs = Vec_IntSize(&p->vTemp)/2;
            RangeSize = p->FuncRangeId ? Ptr_NtkRangeSize(p->pNtk, p->FuncRangeId) : 1;
            p->FuncNameId = p->FuncRangeId = 0;
            if ( Status == 0 )                  return 0;
            if ( nInputs == 1 )
                Type = CBA_BOX_DEC;
            else if ( nInputs == RangeSize + 1 )
                Type = CBA_BOX_SEL;
            else if ( nInputs == (1 << RangeSize) + 1 )
                Type = CBA_BOX_NMUX;
            else                                return Prs_ManErrorSet(p, "Cannot determine word-level operator.", 0);
            p->pCur++;
            if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 24.", 0);
            // save word-level operator
            Vec_IntInsert( &p->vTemp, 0, 0 );
            Vec_IntInsert( &p->vTemp, 1, OutItem );
            Prs_NtkAddBox( p->pNtk, Type, 0, &p->vTemp );
            return 1;
        }
        Vec_IntPush( &p->vTemp, 0 );
        Vec_IntPush( &p->vTemp, Item );
        if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 24.", 0);
        assert( !Prs_ManIsChar(p, '[') );

        // get the next symbol
        if ( Prs_ManIsChar(p, ',') || Prs_ManIsChar(p, ';') )
            Type = CBA_BOX_BUF;
        else if ( Prs_ManIsChar(p, '?') )
        {
            p->pCur++;
            Item = Prs_ManReadSignal( p );
            if ( Item == 0 )                    return 0;
            Vec_IntPush( &p->vTemp, 0 );
            Vec_IntPush( &p->vTemp, Item );
            if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 24.", 0);
            if ( !Prs_ManIsChar(p, ':') )       return Prs_ManErrorSet(p, "MUX lacks the colon symbol (:).", 0);

            p->pCur++;
            Item = Prs_ManReadSignal( p );
            if ( Item == 0 )                    return 0;
            Vec_IntPush( &p->vTemp, 0 );
            Vec_IntPush( &p->vTemp, Item );
            if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 24.", 0);
            assert( Vec_IntSize(&p->vTemp) == 8 );
            //ABC_SWAP( int, Vec_IntArray(&p->vTemp)[3], Vec_IntArray(&p->vTemp)[5] );
            Type = CBA_BOX_MUX;
        }
        else 
        {
                 if ( p->pCur[0] == '>' && p->pCur[1] == '>' && p->pCur[2] != '>' )  p->pCur += 2, Type = fRotating ? CBA_BOX_ROTR : CBA_BOX_SHIR;
            else if ( p->pCur[0] == '>' && p->pCur[1] == '>' && p->pCur[2] == '>' )  p->pCur += 3, Type = CBA_BOX_SHIRA;      
            else if ( p->pCur[0] == '<' && p->pCur[1] == '<' && p->pCur[2] != '<' )  p->pCur += 2, Type = fRotating ? CBA_BOX_ROTL : CBA_BOX_SHIL;
            else if ( p->pCur[0] == '<' && p->pCur[1] == '<' && p->pCur[2] == '<' )  p->pCur += 3, Type = CBA_BOX_SHILA;      
            else if ( p->pCur[0] == '&' && p->pCur[1] != '&'                      )  p->pCur += 1, Type = CBA_BOX_AND;       
            else if ( p->pCur[0] == '|' && p->pCur[1] != '|'                      )  p->pCur += 1, Type = CBA_BOX_OR;        
            else if ( p->pCur[0] == '^' && p->pCur[1] != '^'                      )  p->pCur += 1, Type = CBA_BOX_XOR;       
            else if ( p->pCur[0] == '&' && p->pCur[1] == '&'                      )  p->pCur += 2, Type = CBA_BOX_LAND;     
            else if ( p->pCur[0] == '|' && p->pCur[1] == '|'                      )  p->pCur += 2, Type = CBA_BOX_LOR;      
            else if ( p->pCur[0] == '=' && p->pCur[1] == '='                      )  p->pCur += 2, Type = CBA_BOX_EQU;      
            else if ( p->pCur[0] == '!' && p->pCur[1] == '='                      )  p->pCur += 2, Type = CBA_BOX_NEQU;      
            else if ( p->pCur[0] == '<' && p->pCur[1] != '='                      )  p->pCur += 1, Type = CBA_BOX_LTHAN;     
            else if ( p->pCur[0] == '>' && p->pCur[1] != '='                      )  p->pCur += 1, Type = CBA_BOX_MTHAN;     
            else if ( p->pCur[0] == '<' && p->pCur[1] == '='                      )  p->pCur += 2, Type = CBA_BOX_LETHAN;
            else if ( p->pCur[0] == '>' && p->pCur[1] == '='                      )  p->pCur += 2, Type = CBA_BOX_METHAN;  
            else if ( p->pCur[0] == '+'                                           )  p->pCur += 1, Type = CBA_BOX_ADD;       
            else if ( p->pCur[0] == '-'                                           )  p->pCur += 1, Type = CBA_BOX_SUB;       
            else if ( p->pCur[0] == '*' && p->pCur[1] != '*'                      )  p->pCur += 1, Type = CBA_BOX_MUL;     
            else if ( p->pCur[0] == '/'                                           )  p->pCur += 1, Type = CBA_BOX_DIV;        
            else if ( p->pCur[0] == '%'                                           )  p->pCur += 1, Type = CBA_BOX_MOD;   
            else if ( p->pCur[0] == '*' && p->pCur[1] == '*'                      )  p->pCur += 2, Type = CBA_BOX_POW;
            else return Prs_ManErrorSet(p, "Unsupported operation.", 0);

            Item = Prs_ManReadSignal( p );
            if ( Item == 0 )                    return 0;
            Vec_IntPush( &p->vTemp, 0 );
            Vec_IntPush( &p->vTemp, Item );
            // for adder insert carry-in
            if ( Type == CBA_BOX_ADD )
                Vec_IntInsert( &p->vTemp, 2, 0 );
            if ( Type == CBA_BOX_ADD )
                Vec_IntInsert( &p->vTemp, 3, 0 );
        }
    }
    if ( Prs_ManUtilSkipSpaces(p) )                              return Prs_ManErrorSet(p, "Error number 24.", 0);
    // make sure there is nothing left there
    if ( fRotating )
    {
        Prs_ManUtilSkipUntilWord(p, ";");
        p->pCur--;
    }
    else if ( !Prs_ManIsChar(p, ',') && !Prs_ManIsChar(p, ';') ) return Prs_ManErrorSet(p, "Trailing symbols on this line.", 0);
    // save binary operator
    Prs_NtkAddBox( p->pNtk, Type, 0, &p->vTemp );
    return 1;
}